

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O0

void __thiscall
pstack::Procman::ProcessLocation::ProcessLocation(ProcessLocation *this,Process *proc,Addr address_)

{
  Addr elf_00;
  bool bVar1;
  __tuple_element_t<0UL,_tuple<unsigned_long,_shared_ptr<Object>,_const_Elf64_Phdr_*>_> *p_Var2;
  __shared_ptr *this_00;
  shared_ptr<pstack::Procman::CodeLocation> local_b8;
  long local_a8;
  shared_ptr<pstack::Dwarf::Info> local_a0;
  byte local_89;
  shared_ptr<pstack::Elf::Object> local_88;
  undefined1 local_78 [8];
  sptr dwarf;
  type *phdr;
  type *elf;
  type_conflict *elfReloc;
  tuple<unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*> local_40;
  element_type *local_20;
  Addr address__local;
  Process *proc_local;
  ProcessLocation *this_local;
  
  local_20 = (element_type *)address_;
  address__local = (Addr)proc;
  proc_local = (Process *)this;
  std::shared_ptr<pstack::Procman::CodeLocation>::shared_ptr(&this->codeloc);
  Process::findSegment(&local_40,(Process *)address__local,(Addr)local_20);
  p_Var2 = std::get<0ul,unsigned_long,std::shared_ptr<pstack::Elf::Object>,Elf64_Phdr_const*>
                     (&local_40);
  this_00 = (__shared_ptr *)
            std::get<1ul,unsigned_long,std::shared_ptr<pstack::Elf::Object>,Elf64_Phdr_const*>
                      (&local_40);
  dwarf.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::get<2ul,unsigned_long,std::shared_ptr<pstack::Elf::Object>,Elf64_Phdr_const*>(&local_40)
  ;
  bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
  elf_00 = address__local;
  local_89 = 0;
  if (bVar1) {
    std::shared_ptr<pstack::Elf::Object>::shared_ptr
              (&local_88,(shared_ptr<pstack::Elf::Object> *)this_00);
    local_89 = 1;
    Process::getDwarf((Process *)local_78,(sptr *)elf_00);
  }
  else {
    std::shared_ptr<pstack::Dwarf::Info>::shared_ptr
              ((shared_ptr<pstack::Dwarf::Info> *)local_78,(nullptr_t)0x0);
  }
  if ((local_89 & 1) != 0) {
    std::shared_ptr<pstack::Elf::Object>::~shared_ptr(&local_88);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
  if (bVar1) {
    local_a8 = (long)local_20 - *p_Var2;
    std::
    make_shared<pstack::Procman::CodeLocation,std::shared_ptr<pstack::Dwarf::Info>&,Elf64_Phdr_const*&,unsigned_long>
              (&local_a0,(Elf64_Phdr **)local_78,
               (unsigned_long *)
               dwarf.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    std::shared_ptr<pstack::Procman::CodeLocation>::operator=
              (&this->codeloc,(shared_ptr<pstack::Procman::CodeLocation> *)&local_a0);
    std::shared_ptr<pstack::Procman::CodeLocation>::~shared_ptr
              ((shared_ptr<pstack::Procman::CodeLocation> *)&local_a0);
  }
  else {
    std::shared_ptr<pstack::Procman::CodeLocation>::shared_ptr(&local_b8,(nullptr_t)0x0);
    std::shared_ptr<pstack::Procman::CodeLocation>::operator=(&this->codeloc,&local_b8);
    std::shared_ptr<pstack::Procman::CodeLocation>::~shared_ptr(&local_b8);
  }
  this->location_ = (Addr)local_20;
  std::shared_ptr<pstack::Dwarf::Info>::~shared_ptr((shared_ptr<pstack::Dwarf::Info> *)local_78);
  std::tuple<unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>::~tuple
            (&local_40);
  return;
}

Assistant:

ProcessLocation::ProcessLocation(Process &proc, Elf::Addr address_) {
    auto [ elfReloc, elf, phdr ] = proc.findSegment(address_);
    auto dwarf = elf ? proc.getDwarf(elf) : nullptr;
    if (dwarf) {
        codeloc = std::make_shared<CodeLocation>(dwarf, phdr, address_ - elfReloc);
    } else {
        codeloc = nullptr;
    }
    location_ = address_;
}